

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_float64_primitive_greaterThan
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  sysbvm_object_tuple_t *floatObject;
  double dVar2;
  double dVar3;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  uVar1 = *arguments;
  dVar2 = 0.0;
  dVar3 = 0.0;
  if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
    dVar3 = *(double *)(uVar1 + 0x10);
  }
  uVar1 = arguments[1];
  if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
    dVar2 = *(double *)(uVar1 + 0x10);
  }
  return (ulong)(dVar2 < dVar3) << 4 | 0xf;
}

Assistant:

static sysbvm_tuple_t sysbvm_float64_primitive_greaterThan(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_float64_t left = sysbvm_tuple_float64_decode(arguments[0]);
    sysbvm_float64_t right = sysbvm_tuple_float64_decode(arguments[1]);
    return sysbvm_tuple_boolean_encode(left > right);
}